

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

uint __thiscall
CVmObjIterLookupTable::find_first_valid_entry(CVmObjIterLookupTable *this,uint entry)

{
  char *buf;
  uint *puVar1;
  vm_lookup_val *pool;
  vm_val_t coll;
  vm_val_t local_20;
  
  buf = (this->super_CVmObjIter).super_CVmObject.ext_;
  local_20.typ = (vm_datatype_t)*buf;
  vmb_get_dh_val(buf,&local_20);
  puVar1 = *(uint **)((long)&G_obj_table_X.pages_[local_20.val.obj >> 0xc][local_20.val.obj & 0xfff]
                             .ptr_ + 8);
  if (entry <= puVar1[1]) {
    do {
      if (puVar1[(ulong)*puVar1 * 2 + (ulong)(entry - 1) * 10 + 8] != 0xd) {
        return entry;
      }
      entry = entry + 1;
    } while (entry <= puVar1[1]);
  }
  return 0;
}

Assistant:

uint CVmObjIterLookupTable::find_first_valid_entry(VMG_ uint entry) const
{
    CVmObjLookupTable *ltab;
    vm_val_t coll;

    /* get my lookup table object */
    get_coll_val(&coll);
    ltab = (CVmObjLookupTable *)vm_objp(vmg_ coll.val.obj);

    /* if we're already past the last item, we have nothing to find */
    if (entry > ltab->get_entry_count())
        return 0;

    /* 
     *   scan entries until we find one with a non-empty key (an empty key
     *   value indicates that the entry is free) 
     */
    for ( ; entry <= ltab->get_entry_count() ; ++entry)
    {
        vm_lookup_val *entryp;

        /* translate the 1-based index to an entry pointer */
        entryp = ltab->get_ext()->idx_to_val(entry - 1);

        /* if it's non-empty, this is the one we want */
        if (entryp->key.typ != VM_EMPTY)
            return entry;
    }

    /* we didn't find a valid entry */
    return 0;
}